

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

Expected<llvm::DWARFDebugLoc::LocationList> * __thiscall
llvm::DWARFDebugLoc::parseOneLocationList
          (Expected<llvm::DWARFDebugLoc::LocationList> *__return_storage_ptr__,DWARFDebugLoc *this,
          DWARFDataExtractor *Data,uint64_t *Offset)

{
  SmallVectorStorage<unsigned_char,_4U> *C_00;
  uint64_t uVar1;
  uint16_t uVar2;
  undefined1 local_e8 [8];
  LocationList LL;
  undefined1 local_78 [8];
  Entry E;
  Cursor C;
  
  LL.Offset = (uint64_t)
              &LL.Entries.super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
               super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
               super_SmallVectorBase.Size;
  LL.Entries.super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX =
       (void *)0x200000000;
  local_e8 = (undefined1  [8])*Offset;
  this->AddressSize = (uint)(Data->super_DataExtractor).AddressSize;
  C_00 = &E.Loc.super_SmallVectorStorage<unsigned_char,_4U>;
  C.Offset = 1;
  LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].buffer._32_8_ =
       Offset;
  E.Loc._16_8_ = local_e8;
  do {
    E.Loc.super_SmallVectorImpl<unsigned_char>.super_SmallVectorTemplateBase<unsigned_char,_true>.
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
         (void *)0x400000000;
    E.End = (uint64_t)
            &E.Loc.super_SmallVectorImpl<unsigned_char>.
             super_SmallVectorTemplateBase<unsigned_char,_true>.
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    local_78 = (undefined1  [8])
               DWARFDataExtractor::getRelocatedAddress(Data,(Cursor *)C_00,(uint64_t *)0x0);
    E.Begin = DWARFDataExtractor::getRelocatedAddress(Data,(Cursor *)C_00,(uint64_t *)0x0);
    uVar1 = C.Offset;
    C.Offset = 0;
    if (1 < uVar1) {
      C.Err.Payload = (ErrorInfoBase *)(uVar1 | 1);
      Expected<llvm::DWARFDebugLoc::LocationList>::Expected(__return_storage_ptr__,&C.Err);
      if ((long *)((ulong)C.Err.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)C.Err.Payload & 0xfffffffffffffffe) + 8))();
      }
LAB_00d91ce1:
      SmallVectorImpl<unsigned_char>::~SmallVectorImpl((SmallVectorImpl<unsigned_char> *)&E.End);
      if ((long *)(C.Offset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(C.Offset & 0xfffffffffffffffe) + 8))();
      }
      SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
                ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)&LL);
      return __return_storage_ptr__;
    }
    if (E.Begin == 0 && local_78 == (undefined1  [8])0x0) {
      *(undefined8 *)
       LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].buffer.
       _32_8_ = E.Loc._16_8_;
      Expected<llvm::DWARFDebugLoc::LocationList>::Expected<llvm::DWARFDebugLoc::LocationList>
                (__return_storage_ptr__,(LocationList *)local_e8,(type *)0x0);
      goto LAB_00d91ce1;
    }
    if (local_78 != (undefined1  [8])(-(ulong)(this->AddressSize != 4) | 0xffffffff)) {
      uVar2 = DataExtractor::getU16(&Data->super_DataExtractor,(Cursor *)C_00);
      DataExtractor::getU8
                (&Data->super_DataExtractor,(Cursor *)C_00,(SmallVectorImpl<unsigned_char> *)&E.End,
                 (uint)uVar2);
    }
    SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::push_back
              ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *)&LL,(Entry *)local_78);
    SmallVectorImpl<unsigned_char>::~SmallVectorImpl((SmallVectorImpl<unsigned_char> *)&E.End);
  } while( true );
}

Assistant:

Expected<DWARFDebugLoc::LocationList>
DWARFDebugLoc::parseOneLocationList(const DWARFDataExtractor &Data,
                                    uint64_t *Offset) {
  LocationList LL;
  LL.Offset = *Offset;
  AddressSize = Data.getAddressSize();
  DataExtractor::Cursor C(*Offset);

  // 2.6.2 Location Lists
  // A location list entry consists of:
  while (true) {
    Entry E;

    // 1. A beginning address offset. ...
    E.Begin = Data.getRelocatedAddress(C);

    // 2. An ending address offset. ...
    E.End = Data.getRelocatedAddress(C);

    if (Error Err = C.takeError())
      return std::move(Err);

    // The end of any given location list is marked by an end of list entry,
    // which consists of a 0 for the beginning address offset and a 0 for the
    // ending address offset.
    if (E.Begin == 0 && E.End == 0) {
      *Offset = C.tell();
      return LL;
    }

    if (E.Begin != (AddressSize == 4 ? -1U : -1ULL)) {
      unsigned Bytes = Data.getU16(C);
      // A single location description describing the location of the object...
      Data.getU8(C, E.Loc, Bytes);
    }

    LL.Entries.push_back(std::move(E));
  }
}